

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ModelDescription::InternalSwap
          (ModelDescription *this,ModelDescription *other)

{
  ModelDescription *other_local;
  ModelDescription *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->input_).super_RepeatedPtrFieldBase,&(other->input_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->output_).super_RepeatedPtrFieldBase,
             &(other->output_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->traininginput_).super_RepeatedPtrFieldBase,
             &(other->traininginput_).super_RepeatedPtrFieldBase);
  std::swap<std::__cxx11::string*>
            (&(this->predictedfeaturename_).ptr_,&(other->predictedfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->predictedprobabilitiesname_).ptr_,&(other->predictedprobabilitiesname_).ptr_);
  std::swap<CoreML::Specification::Metadata*>(&this->metadata_,&other->metadata_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ModelDescription::InternalSwap(ModelDescription* other) {
  input_.InternalSwap(&other->input_);
  output_.InternalSwap(&other->output_);
  traininginput_.InternalSwap(&other->traininginput_);
  predictedfeaturename_.Swap(&other->predictedfeaturename_);
  predictedprobabilitiesname_.Swap(&other->predictedprobabilitiesname_);
  std::swap(metadata_, other->metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}